

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

void __thiscall AActor::Revive(AActor *this)

{
  uint uVar1;
  BYTE *pBVar2;
  int iVar3;
  undefined4 extraout_var;
  
  if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
    iVar3 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
    (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
  }
  pBVar2 = ((this->super_DThinker).super_DObject.Class)->Defaults;
  uVar1 = *(uint *)(pBVar2 + 0x1bc);
  (this->flags).Value = uVar1;
  (this->flags2).Value = *(uint *)(pBVar2 + 0x1c0);
  (this->flags3).Value = *(uint *)(pBVar2 + 0x1c4);
  (this->flags4).Value = *(uint *)(pBVar2 + 0x1c8);
  (this->flags5).Value = *(uint *)(pBVar2 + 0x1cc);
  (this->flags6).Value = *(uint *)(pBVar2 + 0x1d0);
  (this->flags7).Value = *(uint *)(pBVar2 + 0x1d4);
  if ((this->SpawnFlags & 0x2000) != 0) {
    (this->flags).Value = uVar1 | 0x8000000;
  }
  (this->DamageType).super_FName.Index = *(int *)(pBVar2 + 0x404);
  iVar3 = SpawnHealth(this);
  this->health = iVar3;
  (this->target).field_0.p = (AActor *)0x0;
  (this->lastenemy).field_0.p = (AActor *)0x0;
  if (((this->flags).Value & 0x8400000) == 0x400000) {
    level.total_monsters = level.total_monsters + 1;
  }
  return;
}

Assistant:

void AActor::Revive()
{
	AActor *info = GetDefault();
	flags = info->flags;
	flags2 = info->flags2;
	flags3 = info->flags3;
	flags4 = info->flags4;
	flags5 = info->flags5;
	flags6 = info->flags6;
	flags7 = info->flags7;
	if (SpawnFlags & MTF_FRIENDLY) flags |= MF_FRIENDLY;
	DamageType = info->DamageType;
	health = SpawnHealth();
	target = NULL;
	lastenemy = NULL;

	// [RH] If it's a monster, it gets to count as another kill
	if (CountsAsKill())
	{
		level.total_monsters++;
	}
}